

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::FeatureType::set_allocated_int64type
          (FeatureType *this,Int64FeatureType *int64type)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_Type(this);
  if (int64type != (Int64FeatureType *)0x0) {
    submessage_arena = (Arena *)(int64type->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      int64type = (Int64FeatureType *)
                  google::protobuf::internal::GetOwnedMessageInternal
                            (message_arena,&int64type->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 1;
    (this->Type_).int64type_ = int64type;
  }
  return;
}

Assistant:

void FeatureType::set_allocated_int64type(::CoreML::Specification::Int64FeatureType* int64type) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_Type();
  if (int64type) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::Int64FeatureType>::GetOwningArena(int64type);
    if (message_arena != submessage_arena) {
      int64type = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, int64type, submessage_arena);
    }
    set_has_int64type();
    Type_.int64type_ = int64type;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.FeatureType.int64Type)
}